

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::EnumDescriptor::GetLocationPath
          (EnumDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  EnumDescriptor **ppEVar1;
  int local_1c;
  
  if (this->containing_type_ == (Descriptor *)0x0) {
    local_1c = 5;
  }
  else {
    Descriptor::GetLocationPath(this->containing_type_,output);
    local_1c = 4;
  }
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,&local_1c);
  ppEVar1 = &this->file_->enum_types_;
  if (this->containing_type_ != (Descriptor *)0x0) {
    ppEVar1 = &this->containing_type_->enum_types_;
  }
  local_1c = (int)(((long)this - (long)*ppEVar1) / 0x58);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,&local_1c);
  return;
}

Assistant:

void EnumDescriptor::GetLocationPath(std::vector<int>* output) const {
  if (containing_type()) {
    containing_type()->GetLocationPath(output);
    output->push_back(DescriptorProto::kEnumTypeFieldNumber);
    output->push_back(index());
  } else {
    output->push_back(FileDescriptorProto::kEnumTypeFieldNumber);
    output->push_back(index());
  }
}